

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::XThreadFulfiller<int>::fulfill(XThreadFulfiller<int> *this,FixVoid<int> *value)

{
  FulfillScope scope;
  FulfillScope local_1b8;
  ExceptionOr<int> local_1b0;
  
  XThreadPaf::FulfillScope::FulfillScope(&local_1b8,&this->target);
  if (local_1b8.obj != (XThreadPaf *)0x0) {
    local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b0.value.ptr.isSet = true;
    local_1b0.value.ptr.field_1.value = *value;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)(local_1b8.obj + 1),&local_1b0);
    if (local_1b0.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b0.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_1b8);
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result = kj::mv(value);
    }
  }